

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::NumConsumedLocations
          (ValidationState_t *_,Instruction *type,uint32_t *num_locations)

{
  bool bVar1;
  AddressingModel AVar2;
  StorageClass SVar3;
  uint uVar4;
  spv_result_t sVar5;
  uint id;
  spv_result_t sVar6;
  Instruction *pIVar7;
  ulong uVar8;
  ulong index;
  string local_228;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  *num_locations = 0;
  sVar6 = SPV_UNSUPPORTED;
  switch((type->inst_).opcode) {
  case 0x15:
  case 0x16:
    goto switchD_001f48a4_caseD_15;
  case 0x17:
    bVar1 = ValidationState_t::ContainsSizedIntOrFloatType(_,(type->inst_).result_id,OpTypeInt,0x40)
    ;
    if ((bVar1) ||
       (bVar1 = ValidationState_t::ContainsSizedIntOrFloatType
                          (_,(type->inst_).result_id,OpTypeFloat,0x40), bVar1)) {
      uVar4 = Instruction::GetOperandAs<unsigned_int>(type,2);
      sVar6 = SPV_END_OF_STREAM;
      if (2 < uVar4) goto switchD_001f48a4_caseD_15;
    }
    sVar6 = SPV_UNSUPPORTED;
    goto switchD_001f48a4_caseD_15;
  case 0x18:
    uVar4 = Instruction::GetOperandAs<unsigned_int>(type,1);
    pIVar7 = ValidationState_t::FindDef(_,uVar4);
    NumConsumedLocations(_,pIVar7,num_locations);
    local_208._0_4_ = Instruction::GetOperandAs<unsigned_int>(type,2);
    break;
  case 0x1c:
    uVar4 = Instruction::GetOperandAs<unsigned_int>(type,1);
    pIVar7 = ValidationState_t::FindDef(_,uVar4);
    NumConsumedLocations(_,pIVar7,num_locations);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(type,2);
    ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar4);
    if (local_203 != '\x01') {
      return SPV_SUCCESS;
    }
    if (local_208[4] == false) {
      return SPV_SUCCESS;
    }
    break;
  case 0x1e:
    bVar1 = ValidationState_t::HasDecoration(_,(type->inst_).result_id,DecorationLocation);
    if (!bVar1) {
      bVar1 = 0x10 < (ulong)((long)(type->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(type->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
      if (bVar1) {
        local_208._0_4_ = 0;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(type,1);
        pIVar7 = ValidationState_t::FindDef(_,uVar4);
        sVar5 = NumConsumedLocations(_,pIVar7,(uint32_t *)local_208);
        sVar6 = sVar5;
        if (sVar5 == SPV_SUCCESS) {
          uVar4 = 2;
          do {
            *num_locations = *num_locations + local_208._0_4_;
            index = (ulong)uVar4;
            uVar8 = (long)(type->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(type->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4;
            bVar1 = index < uVar8;
            sVar6 = sVar5;
            if (uVar8 <= index) break;
            local_208._0_4_ = 0;
            id = Instruction::GetOperandAs<unsigned_int>(type,index);
            pIVar7 = ValidationState_t::FindDef(_,id);
            sVar6 = NumConsumedLocations(_,pIVar7,(uint32_t *)local_208);
            uVar4 = uVar4 + 1;
          } while (sVar6 == SPV_SUCCESS);
        }
      }
      if (!bVar1) {
        return SPV_SUCCESS;
      }
      return sVar6;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,type);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_228,_,0x1336,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Members cannot be assigned a location",0x25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001f49e7;
  case 0x20:
    AVar2 = ValidationState_t::addressing_model(_);
    if ((AVar2 == PhysicalStorageBuffer64) &&
       (SVar3 = Instruction::GetOperandAs<spv::StorageClass>(type,1), SVar3 == PhysicalStorageBuffer
       )) goto switchD_001f48a4_caseD_15;
  default:
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,type);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Invalid type to assign a location",0x21);
LAB_001f49e7:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    return local_38;
  }
  sVar6 = local_208._0_4_ * *num_locations;
switchD_001f48a4_caseD_15:
  *num_locations = sVar6;
  return SPV_SUCCESS;
}

Assistant:

spv_result_t NumConsumedLocations(ValidationState_t& _, const Instruction* type,
                                  uint32_t* num_locations) {
  *num_locations = 0;
  switch (type->opcode()) {
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      // Scalars always consume a single location.
      *num_locations = 1;
      break;
    case spv::Op::OpTypeVector:
      // 3- and 4-component 64-bit vectors consume two locations.
      if ((_.ContainsSizedIntOrFloatType(type->id(), spv::Op::OpTypeInt, 64) ||
           _.ContainsSizedIntOrFloatType(type->id(), spv::Op::OpTypeFloat,
                                         64)) &&
          (type->GetOperandAs<uint32_t>(2) > 2)) {
        *num_locations = 2;
      } else {
        *num_locations = 1;
      }
      break;
    case spv::Op::OpTypeMatrix:
      // Matrices consume locations equal to the underlying vector type for
      // each column.
      NumConsumedLocations(_, _.FindDef(type->GetOperandAs<uint32_t>(1)),
                           num_locations);
      *num_locations *= type->GetOperandAs<uint32_t>(2);
      break;
    case spv::Op::OpTypeArray: {
      // Arrays consume locations equal to the underlying type times the number
      // of elements in the vector.
      NumConsumedLocations(_, _.FindDef(type->GetOperandAs<uint32_t>(1)),
                           num_locations);
      bool is_int = false;
      bool is_const = false;
      uint32_t value = 0;
      // Attempt to evaluate the number of array elements.
      std::tie(is_int, is_const, value) =
          _.EvalInt32IfConst(type->GetOperandAs<uint32_t>(2));
      if (is_int && is_const) *num_locations *= value;
      break;
    }
    case spv::Op::OpTypeStruct: {
      // Members cannot have location decorations at this point.
      if (_.HasDecoration(type->id(), spv::Decoration::Location)) {
        return _.diag(SPV_ERROR_INVALID_DATA, type)
               << _.VkErrorID(4918) << "Members cannot be assigned a location";
      }

      // Structs consume locations equal to the sum of the locations consumed
      // by the members.
      for (uint32_t i = 1; i < type->operands().size(); ++i) {
        uint32_t member_locations = 0;
        if (auto error = NumConsumedLocations(
                _, _.FindDef(type->GetOperandAs<uint32_t>(i)),
                &member_locations)) {
          return error;
        }
        *num_locations += member_locations;
      }
      break;
    }
    case spv::Op::OpTypePointer: {
      if (_.addressing_model() ==
              spv::AddressingModel::PhysicalStorageBuffer64 &&
          type->GetOperandAs<spv::StorageClass>(1) ==
              spv::StorageClass::PhysicalStorageBuffer) {
        *num_locations = 1;
        break;
      }
      [[fallthrough]];
    }
    default:
      return _.diag(SPV_ERROR_INVALID_DATA, type)
             << "Invalid type to assign a location";
  }

  return SPV_SUCCESS;
}